

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLNode::DeleteChildren(XMLNode *this)

{
  XMLNode *child;
  XMLNode *node;
  XMLNode *this_local;
  
  while (this->_firstChild != (XMLNode *)0x0) {
    child = this->_firstChild;
    Unlink(this,child);
    DeleteNode(child);
  }
  this->_lastChild = (XMLNode *)0x0;
  this->_firstChild = (XMLNode *)0x0;
  return;
}

Assistant:

void XMLNode::DeleteChildren()
{
    while( _firstChild ) {
        TIXMLASSERT( _lastChild );
        TIXMLASSERT( _firstChild->_document == _document );
        XMLNode* node = _firstChild;
        Unlink( node );

        DeleteNode( node );
    }
    _firstChild = _lastChild = 0;
}